

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O1

void __thiscall sznet::CountDownLatch::countDown(CountDownLatch *this)

{
  MutexLock *mutex;
  int *piVar1;
  MutexLockGuard lock;
  
  mutex = &this->m_mutex;
  sz_mutex_lock(&mutex->m_mutex);
  MutexLock::assignHolder(mutex);
  piVar1 = &this->m_count;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    sz_cond_notifyall(&(this->m_condition).m_cond);
  }
  (this->m_mutex).m_holder = 0;
  sz_mutex_unlock(&mutex->m_mutex);
  return;
}

Assistant:

void CountDownLatch::countDown()
{
	MutexLockGuard lock(m_mutex);
	--m_count;
	if (m_count == 0)
	{
		m_condition.notifyAll();
	}
}